

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O3

void test_open_address_hashmap_initialize(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  ion_hashmap_t map;
  ion_hashmap_t local_48;
  
  local_48.super.key_type = key_type_numeric_signed;
  local_48.super.compare = dictionary_compare_signed_value;
  oah_initialize(&local_48,oah_compute_simple_hash,key_type_numeric_signed,4,10,10);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(local_48.super.record.key_size == 4),0x74,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(local_48.super.record.value_size == 10),0x75,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(local_48.map_size == 10),0x76,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 != '\0') {
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(local_48.compute_hash == oah_compute_simple_hash),0x77,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar1 != '\0') {
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(local_48.write_concern == '\x01'),0x78,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 != '\0') {
            iVar2 = oah_destroy(&local_48);
            pVar1 = planck_unit_assert_true
                              (tc,(uint)(iVar2 == '\0'),0x7a,
                               "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                               ,"condition was false, expected true");
            if (pVar1 != '\0') {
              return;
            }
          }
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_initialize(
	planck_unit_test_t *tc
) {
	/* this is required for initializing the hash map and should come from the dictionary */
	int					size;
	ion_record_info_t	record;

	record.key_size		= sizeof(int);
	record.value_size	= 10;
	size				= 10;

	ion_hashmap_t map;

	map.super.key_type = key_type_numeric_signed;	/* default to use int key type */

	initialize_hash_map(size, &record, &map);

	/* valid correct map settings */
	PLANCK_UNIT_ASSERT_TRUE(tc, map.super.record.key_size == record.key_size);
	PLANCK_UNIT_ASSERT_TRUE(tc, map.super.record.value_size == record.value_size);
	PLANCK_UNIT_ASSERT_TRUE(tc, map.map_size == size);
	PLANCK_UNIT_ASSERT_TRUE(tc, map.compute_hash == &oah_compute_simple_hash);
	PLANCK_UNIT_ASSERT_TRUE(tc, map.write_concern == wc_insert_unique);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}